

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void ec_pubkey_parse_pointtest(uchar *input,int xvalid,int yvalid)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  secp256k1_context *psVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  secp256k1_scalar *message;
  size_t count;
  secp256k1_scalar *extraout_RDX;
  secp256k1_scalar *sigr;
  secp256k1_scalar *psVar8;
  secp256k1_scalar *seckey;
  uint uVar9;
  undefined1 *puVar10;
  secp256k1_ge *ge_00;
  secp256k1_scalar *sigs;
  secp256k1_context *psVar11;
  ulong uVar12;
  ulong uVar13;
  int *recid;
  byte bVar14;
  undefined1 *unaff_R12;
  secp256k1_ge *r;
  secp256k1_ge *output;
  secp256k1_ge *output_00;
  secp256k1_ge *psVar15;
  uint uVar16;
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_result;
  size_t outl;
  unsigned_long _zzq_args [6];
  uchar pubkeyc [65];
  secp256k1_ge ge;
  secp256k1_scalar sStack_260;
  secp256k1_ge *psStack_238;
  secp256k1_ge *psStack_230;
  secp256k1_context *psStack_228;
  secp256k1_ge *psStack_220;
  code *pcStack_218;
  long alStack_210 [5];
  undefined1 *puStack_1e8;
  secp256k1_ge *psStack_1e0;
  char local_1d1;
  undefined8 local_1d0;
  undefined1 local_1c8 [65];
  byte abStack_187 [7];
  secp256k1_ge *psStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  size_t local_138;
  int local_130;
  uint local_12c;
  secp256k1_ge *local_128;
  ulong local_120;
  undefined1 local_118 [89];
  uint64_t uStack_bf;
  undefined8 local_b7;
  uint64_t uStack_af;
  uint64_t local_a7;
  uint64_t uStack_9f;
  secp256k1_ge local_88;
  
  local_138 = 3;
  local_1c8._56_4_ = xvalid;
  local_130 = yvalid;
  local_128 = (secp256k1_ge *)input;
LAB_0016d6ab:
  local_118._65_8_ = (((secp256k1_ge *)input)->x).n[0];
  local_118._73_8_ = (((secp256k1_ge *)input)->x).n[1];
  local_118._81_8_ = (((secp256k1_ge *)input)->x).n[2];
  uStack_bf = (((secp256k1_ge *)input)->x).n[3];
  local_b7 = (((secp256k1_ge *)input)->x).n[4];
  uStack_af = (((secp256k1_ge *)input)->y).n[0];
  local_a7 = (((secp256k1_ge *)input)->y).n[1];
  uStack_9f = (((secp256k1_ge *)input)->y).n[2];
  local_1d1 = local_1c8._56_4_ != 0 && local_138 == 0x21;
  local_12c = (uint)(local_138 == 0x41) * 4;
  local_120 = (ulong)(local_138 == 0x41 || local_138 == 0x21);
  puVar10 = (undefined1 *)0x0;
  while( true ) {
    output = (secp256k1_ge *)(local_1c8 + 0x40);
    local_118[0x40] = (char)puVar10;
    uVar9 = (uint)puVar10;
    uVar16 = *(uchar *)((long)(((secp256k1_ge *)input)->y).n + 0x17) & 1 | 2;
    output_00 = (secp256k1_ge *)(ulong)uVar16;
    if ((local_1c8._56_4_ == 0 || local_130 == 0) || (uVar9 & 4) != local_12c) {
      r = (secp256k1_ge *)0x0;
    }
    else {
      r = (secp256k1_ge *)
          CONCAT71((int7)((ulong)unaff_R12 >> 8),
                   ((uVar9 & 0xfb) == uVar16 || uVar9 == 4) & (byte)local_120);
    }
    bVar14 = (byte)r;
    psVar11 = CTX;
    if (((local_1d1 != '\0' && (uVar9 & 0xfe) == 2) | bVar14) != 1) break;
    local_118._0_8_ = 0;
    local_118._8_8_ = 0;
    local_118._16_8_ = 0;
    local_118._24_8_ = 0;
    local_118._32_8_ = 0;
    local_118._40_8_ = 0;
    local_118._48_8_ = 0;
    local_118._56_8_ = 0;
    stack0xfffffffffffffe78 = (_func_void_char_ptr_void_ptr *)0x4d430001;
    local_178._0_4_ = 0x40;
    local_178._4_4_ = 0;
    local_170 = 0;
    local_168 = 0;
    local_160 = 0;
    local_1c8._0_8_ = 0;
    psStack_1e0 = (secp256k1_ge *)0x16d883;
    ge_00 = (secp256k1_ge *)local_118;
    psStack_180 = (secp256k1_ge *)local_118;
    iVar5 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)local_118,local_118 + 0x40,local_138);
    input = (uchar *)local_118;
    if (iVar5 == 0) {
LAB_0016ddc7:
      psStack_1e0 = (secp256k1_ge *)0x16ddcc;
      ec_pubkey_parse_pointtest_cold_14();
      psVar15 = (secp256k1_ge *)input;
LAB_0016ddcc:
      psStack_1e0 = (secp256k1_ge *)0x16ddd1;
      ec_pubkey_parse_pointtest_cold_13();
      input = (uchar *)psVar15;
LAB_0016ddd1:
      psStack_1e0 = (secp256k1_ge *)0x16ddd6;
      ec_pubkey_parse_pointtest_cold_2();
      goto LAB_0016ddd6;
    }
    stack0xfffffffffffffe78 = (_func_void_char_ptr_void_ptr *)0x4d430005;
    local_178._0_4_ = 0x40;
    local_178._4_4_ = 0;
    local_170 = 0;
    local_168 = 0;
    local_160 = 0;
    local_1c8._48_8_ = 0x41;
    local_1c8._0_8_ = 0x4d430001;
    local_1c8._16_8_ = 0x41;
    local_1c8._24_8_ = 0;
    local_1c8._32_8_ = 0;
    local_1c8._40_8_ = 0;
    puVar10 = local_1c8;
    local_1d0 = 0;
    uVar12 = 0x102;
    psStack_1e0 = (secp256k1_ge *)0x16d947;
    ge_00 = output;
    psVar11 = CTX;
    local_1c8._8_8_ = output;
    local_1c8._60_4_ = uVar9;
    psStack_180 = (secp256k1_ge *)local_118;
    iVar5 = secp256k1_ec_pubkey_serialize
                      (CTX,(uchar *)output,(size_t *)(local_1c8 + 0x30),
                       (secp256k1_pubkey *)local_118,0x102);
    input = (uchar *)local_128;
    psVar15 = (secp256k1_ge *)local_118;
    if (iVar5 == 0) goto LAB_0016ddcc;
    local_1c8._0_8_ = 0x4d430005;
    local_1c8._8_8_ = output;
    local_1c8._16_8_ = local_1c8._48_8_;
    local_1c8._24_8_ = 0;
    local_1c8._32_8_ = 0;
    local_1c8._40_8_ = 0;
    uVar13 = (ulong)((long)psVar11 << 3) >> 0x33;
    uVar3 = (((long)psVar11 << 3 | (ulong)psVar11 >> 0x3d) << 0xd | uVar13) >> 3;
    psVar11 = (secp256k1_context *)(uVar3 << 0x33 | (uVar13 << 0x3d | uVar3) >> 0xd);
    local_1d0 = 0;
    if (local_1c8._48_8_ != 0x21) goto LAB_0016dddb;
    lVar6 = 1;
    puVar10 = (undefined1 *)(ulong)(uint)local_1c8._60_4_;
    do {
      bVar1 = local_1c8[lVar6 + 0x40];
      ge_00 = (secp256k1_ge *)(ulong)bVar1;
      bVar2 = local_118[lVar6 + 0x40];
      psVar11 = (secp256k1_context *)(ulong)bVar2;
      uVar13 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar13 = uVar12 & 0xffffffff;
      }
      iVar5 = (int)uVar13;
      if (bVar1 != bVar2) goto LAB_0016d9ea;
      lVar6 = lVar6 + 1;
      uVar12 = uVar13;
    } while (lVar6 != 0x21);
    iVar5 = 0;
LAB_0016d9ea:
    if (iVar5 != 0) goto LAB_0016dde0;
    if ((local_138 == 0x21) && (local_1c8[0x40] != local_118[0x40])) goto LAB_0016dde5;
    r = (secp256k1_ge *)local_118;
    if (bVar14 != 0) {
      if (local_1c8[0x40] != (char)uVar16) goto LAB_0016ddea;
      psStack_1e0 = (secp256k1_ge *)0x16da3e;
      ge_00 = &local_88;
      psVar11 = CTX;
      iVar5 = secp256k1_pubkey_load(CTX,&local_88,(secp256k1_pubkey *)r);
      output = &local_88;
      if (iVar5 == 0) goto LAB_0016ddef;
      local_118._48_8_ = 0;
      local_118._56_8_ = 0;
      local_118._32_8_ = 0;
      local_118._40_8_ = 0;
      local_118._16_8_ = 0;
      local_118._24_8_ = 0;
      local_118._0_8_ = 0;
      local_118._8_8_ = 0;
      local_1c8._0_8_ = 0x4d430001;
      local_1c8._16_8_ = 0x40;
      local_1c8._24_8_ = 0;
      local_1c8._32_8_ = 0;
      local_1c8._40_8_ = 0;
      output = (secp256k1_ge *)local_1c8;
      local_1d0 = 0;
      psStack_1e0 = (secp256k1_ge *)0x16dac4;
      local_1c8._8_8_ = r;
      secp256k1_ge_to_storage((secp256k1_ge_storage *)r,&local_88);
      local_1c8._48_8_ = 0x41;
      local_1c8._0_8_ = 0x4d430001;
      output_00 = (secp256k1_ge *)(local_1c8 + 0x40);
      local_1c8._16_8_ = 0x41;
      local_1c8._24_8_ = 0;
      local_1c8._32_8_ = 0;
      local_1c8._40_8_ = 0;
      puVar10 = (undefined1 *)0x40;
      local_1d0 = 0;
      psStack_1e0 = (secp256k1_ge *)0x16db74;
      ge_00 = output_00;
      psVar11 = CTX;
      local_1c8._8_8_ = output_00;
      iVar5 = secp256k1_ec_pubkey_serialize
                        (CTX,(uchar *)output_00,(size_t *)(local_1c8 + 0x30),(secp256k1_pubkey *)r,2
                        );
      if (iVar5 == 0) goto LAB_0016ddf4;
      local_1c8._0_8_ = 0x4d430005;
      local_1c8._8_8_ = output_00;
      local_1c8._16_8_ = local_1c8._48_8_;
      local_1c8._24_8_ = 0;
      local_1c8._32_8_ = 0;
      local_1c8._40_8_ = 0;
      uVar12 = (ulong)((long)psVar11 << 3) >> 0x33;
      uVar13 = (((long)psVar11 << 3 | (ulong)psVar11 >> 0x3d) << 0xd | uVar12) >> 3;
      psVar11 = (secp256k1_context *)(uVar13 << 0x33 | (uVar12 << 0x3d | uVar13) >> 0xd);
      puVar10 = (undefined1 *)0x40;
      local_1d0 = 0;
      if (local_1c8._48_8_ != 0x41) goto LAB_0016ddf9;
      psVar15 = output_00;
      if (local_1c8[0x40] != '\x04') goto LAB_0016ddfe;
      lVar6 = 0;
      puVar10 = (undefined1 *)(ulong)(uint)local_1c8._60_4_;
      do {
        bVar14 = abStack_187[lVar6];
        ge_00 = (secp256k1_ge *)(ulong)bVar14;
        bVar1 = *(uchar *)((long)(((secp256k1_ge *)input)->x).n + lVar6);
        psVar11 = (secp256k1_context *)(ulong)bVar1;
        iVar5 = (uint)bVar14 - (uint)bVar1;
        if (bVar14 != bVar1) goto LAB_0016dc12;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x40);
      iVar5 = 0;
LAB_0016dc12:
      if (iVar5 == 0) goto LAB_0016dd7d;
      goto LAB_0016de03;
    }
LAB_0016dd7d:
    unaff_R12 = local_118;
    uVar9 = (int)puVar10 + 1;
    puVar10 = (undefined1 *)(ulong)uVar9;
    if (uVar9 == 0x100) goto LAB_0016dda3;
  }
  local_118._48_8_ = 0xfefefefefefefefe;
  local_118._56_8_ = 0xfefefefefefefefe;
  local_118._32_8_ = 0xfefefefefefefefe;
  local_118._40_8_ = 0xfefefefefefefefe;
  local_118._16_8_ = 0xfefefefefefefefe;
  local_118._24_8_ = 0xfefefefefefefefe;
  local_118._0_8_ = 0xfefefefefefefefe;
  local_118._8_8_ = 0xfefefefefefefefe;
  stack0xfffffffffffffe78 = (_func_void_char_ptr_void_ptr *)0x4d430001;
  r = (secp256k1_ge *)local_118;
  local_178._0_4_ = 0x40;
  local_178._4_4_ = 0;
  local_170 = 0;
  local_168 = 0;
  local_160 = 0;
  local_1c8._0_8_ = 0;
  psStack_1e0 = (secp256k1_ge *)0x16dcad;
  ge_00 = r;
  psStack_180 = r;
  iVar5 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)r,local_118 + 0x40,local_138);
  psVar4 = CTX;
  if (iVar5 != 0) {
    psStack_1e0 = (secp256k1_ge *)0x16ddc7;
    ec_pubkey_parse_pointtest_cold_1();
    goto LAB_0016ddc7;
  }
  local_178._0_4_ = 0x40;
  local_178._4_4_ = 0;
  local_170 = 0;
  local_168 = 0;
  local_160 = 0;
  local_1c8._0_8_ = 0;
  unique0x1000086b = (CTX->illegal_callback).fn;
  psStack_180 = (secp256k1_ge *)(CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) {
    psStack_1e0 = (secp256k1_ge *)0x16dda1;
    (*(CTX->illegal_callback).fn)("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
  }
  else {
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar4->illegal_callback).data = local_1c8;
  }
  ge_00 = &local_88;
  psStack_1e0 = (secp256k1_ge *)0x16dd52;
  psVar11 = CTX;
  iVar5 = secp256k1_pubkey_load(CTX,ge_00,(secp256k1_pubkey *)r);
  psVar4 = CTX;
  if (iVar5 != 0) goto LAB_0016ddd1;
  (CTX->illegal_callback).fn = stack0xfffffffffffffe78;
  (psVar4->illegal_callback).data = psStack_180;
  if (local_1c8._0_4_ == 1) goto LAB_0016dd7d;
LAB_0016ddd6:
  psStack_1e0 = (secp256k1_ge *)0x16dddb;
  ec_pubkey_parse_pointtest_cold_3();
  psVar15 = (secp256k1_ge *)input;
LAB_0016dddb:
  input = (uchar *)psVar15;
  psStack_1e0 = (secp256k1_ge *)0x16dde0;
  ec_pubkey_parse_pointtest_cold_4();
LAB_0016dde0:
  psStack_1e0 = (secp256k1_ge *)0x16dde5;
  ec_pubkey_parse_pointtest_cold_5();
LAB_0016dde5:
  psStack_1e0 = (secp256k1_ge *)0x16ddea;
  ec_pubkey_parse_pointtest_cold_12();
LAB_0016ddea:
  psStack_1e0 = (secp256k1_ge *)0x16ddef;
  ec_pubkey_parse_pointtest_cold_6();
LAB_0016ddef:
  psStack_1e0 = (secp256k1_ge *)0x16ddf4;
  ec_pubkey_parse_pointtest_cold_11();
LAB_0016ddf4:
  psStack_1e0 = (secp256k1_ge *)0x16ddf9;
  ec_pubkey_parse_pointtest_cold_10();
LAB_0016ddf9:
  psStack_1e0 = (secp256k1_ge *)0x16ddfe;
  ec_pubkey_parse_pointtest_cold_7();
  psVar15 = output_00;
LAB_0016ddfe:
  output_00 = output;
  psStack_1e0 = (secp256k1_ge *)0x16de03;
  ec_pubkey_parse_pointtest_cold_8();
LAB_0016de03:
  psStack_1e0 = (secp256k1_ge *)test_sort_helper;
  ec_pubkey_parse_pointtest_cold_9();
  psStack_1e0 = (secp256k1_ge *)input;
  puStack_1e8 = puVar10;
  if (count != 0) {
    sVar7 = 0;
    do {
      alStack_210[sVar7] =
           (long)((&(psVar11->ecmult_gen_ctx).scalar_offset)[(ge_00->x).n[sVar7] * 2 + -1].d + 3);
      sVar7 = sVar7 + 1;
    } while (count != sVar7);
  }
  pcStack_218 = (code *)0x16de51;
  secp256k1_hsort(alStack_210,count,8,secp256k1_ec_pubkey_sort_cmp,CTX);
  if (count != 0) {
    sVar7 = 0;
    psVar8 = extraout_RDX;
    do {
      message = (secp256k1_scalar *)alStack_210[sVar7];
      sigs = (secp256k1_scalar *)0x0;
      sigr = psVar8;
      do {
        sigr = (secp256k1_scalar *)((ulong)sigr & 0xffffffff);
        bVar14 = *(byte *)((long)sigs->d + (long)message->d);
        recid = (int *)(ulong)bVar14;
        bVar1 = *(byte *)((long)sigs->d + (long)&psVar11->ecmult_gen_ctx);
        psVar8 = (secp256k1_scalar *)(ulong)((uint)bVar14 - (uint)bVar1);
        if (bVar14 != bVar1) goto LAB_0016de83;
        sigs = (secp256k1_scalar *)((long)sigs->d + 1);
      } while (sigs != (secp256k1_scalar *)0x40);
      psVar8 = (secp256k1_scalar *)0x0;
LAB_0016de83:
      if ((int)psVar8 != 0) {
        pcStack_218 = random_sign;
        test_sort_helper_cold_1();
        pcStack_218 = (code *)0x0;
        psStack_238 = r;
        psStack_230 = output_00;
        psStack_228 = psVar11;
        psStack_220 = psVar15;
        do {
          testutil_random_scalar_order_test(&sStack_260);
          iVar5 = secp256k1_ecdsa_sig_sign
                            (&CTX->ecmult_gen_ctx,sigr,sigs,seckey,message,&sStack_260,recid);
        } while (iVar5 == 0);
        return;
      }
      sVar7 = sVar7 + 1;
      psVar11 = (secp256k1_context *)((psVar11->ecmult_gen_ctx).ge_offset.x.n + 3);
    } while (sVar7 != count);
  }
  return;
LAB_0016dda3:
  local_138 = local_138 + 1;
  if (local_138 == 0x42) {
    return;
  }
  goto LAB_0016d6ab;
}

Assistant:

static void ec_pubkey_parse_pointtest(const unsigned char *input, int xvalid, int yvalid) {
    unsigned char pubkeyc[65];
    secp256k1_pubkey pubkey;
    secp256k1_ge ge;
    size_t pubkeyclen;

    for (pubkeyclen = 3; pubkeyclen <= 65; pubkeyclen++) {
        /* Smaller sizes are tested exhaustively elsewhere. */
        int32_t i;
        memcpy(&pubkeyc[1], input, 64);
        SECP256K1_CHECKMEM_UNDEFINE(&pubkeyc[pubkeyclen], 65 - pubkeyclen);
        for (i = 0; i < 256; i++) {
            /* Try all type bytes. */
            int xpass;
            int ypass;
            int ysign;
            pubkeyc[0] = i;
            /* What sign does this point have? */
            ysign = (input[63] & 1) + 2;
            /* For the current type (i) do we expect parsing to work? Handled all of compressed/uncompressed/hybrid. */
            xpass = xvalid && (pubkeyclen == 33) && ((i & 254) == 2);
            /* Do we expect a parse and re-serialize as uncompressed to give a matching y? */
            ypass = xvalid && yvalid && ((i & 4) == ((pubkeyclen == 65) << 2)) &&
                ((i == 4) || ((i & 251) == ysign)) && ((pubkeyclen == 33) || (pubkeyclen == 65));
            if (xpass || ypass) {
                /* These cases must parse. */
                unsigned char pubkeyo[65];
                size_t outl;
                memset(&pubkey, 0, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                outl = 65;
                SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
                SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                CHECK(outl == 33);
                CHECK(secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0);
                CHECK((pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0]));
                if (ypass) {
                    /* This test isn't always done because we decode with alternative signs, so the y won't match. */
                    CHECK(pubkeyo[0] == ysign);
                    CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1);
                    memset(&pubkey, 0, sizeof(pubkey));
                    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                    secp256k1_pubkey_save(&pubkey, &ge);
                    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                    outl = 65;
                    SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1);
                    SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                    CHECK(outl == 65);
                    CHECK(pubkeyo[0] == 4);
                    CHECK(secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0);
                }
            } else {
                /* These cases must fail to parse. */
                memset(&pubkey, 0xfe, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                CHECK_ILLEGAL(CTX, secp256k1_pubkey_load(CTX, &ge, &pubkey));
            }
        }
    }
}